

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

int MutableS2ShapeIndex::CountShapes
              (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
               *edges,ShapeIdSet *cshape_ids)

{
  bool bVar1;
  reference ppCVar2;
  reference piVar3;
  difference_type dVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  ClippedEdge *local_48;
  ClippedEdge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range1;
  const_iterator cnext;
  int last_shape_id;
  int count;
  ShapeIdSet *cshape_ids_local;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *edges_local;
  
  cnext._M_current._4_4_ = 0;
  cnext._M_current._0_4_ = -1;
  __range1 = (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
              *)std::vector<int,_std::allocator<int>_>::begin(cshape_ids);
  __end1 = std::
           vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
           ::begin(edges);
  edge = (ClippedEdge *)
         std::
         vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
         ::end(edges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
                                     *)&edge), bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
              ::operator*(&__end1);
    local_48 = *ppCVar2;
    if (local_48->face_edge->shape_id != (int32)cnext._M_current) {
      cnext._M_current._4_4_ = cnext._M_current._4_4_ + 1;
      cnext._M_current._0_4_ = local_48->face_edge->shape_id;
      while( true ) {
        local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(cshape_ids);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)&__range1,&local_50);
        if ((!bVar1) ||
           (piVar3 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&__range1), (int32)cnext._M_current < *piVar3)) break;
        piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&__range1);
        if (*piVar3 < (int32)cnext._M_current) {
          cnext._M_current._4_4_ = cnext._M_current._4_4_ + 1;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &__range1);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_MutableS2ShapeIndex::ClippedEdge_*const_*,_std::vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>_>
    ::operator++(&__end1);
  }
  local_58._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(cshape_ids);
  dVar4 = __gnu_cxx::operator-
                    (&local_58,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &__range1);
  return cnext._M_current._4_4_ + (int)dVar4;
}

Assistant:

int MutableS2ShapeIndex::CountShapes(const vector<const ClippedEdge*>& edges,
                                     const ShapeIdSet& cshape_ids) {
  int count = 0;
  int last_shape_id = -1;
  ShapeIdSet::const_iterator cnext = cshape_ids.begin();  // Next shape
  for (const ClippedEdge* edge : edges) {
    if (edge->face_edge->shape_id != last_shape_id) {
      ++count;
      last_shape_id = edge->face_edge->shape_id;
      // Skip over any containing shapes up to and including this one,
      // updating "count" appropriately.
      for (; cnext != cshape_ids.end(); ++cnext) {
        if (*cnext > last_shape_id) break;
        if (*cnext < last_shape_id) ++count;
      }
    }
  }
  // Count any remaining containing shapes.
  count += (cshape_ids.end() - cnext);
  return count;
}